

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

PropertyRecord *
Js::TMapKey_ConvertKey_TTD<Js::PropertyRecord_const*>
          (ThreadContext *threadContext,JavascriptString *key)

{
  bool bVar1;
  charcount_t propertyNameLength;
  PropertyRecord *in_RAX;
  PropertyString *pPVar2;
  char16 *propertyName;
  PropertyRecord *local_28;
  PropertyRecord *propertyRecord;
  
  local_28 = in_RAX;
  bVar1 = VarIsImpl<Js::PropertyString>(&key->super_RecyclableObject);
  if ((bVar1) &&
     (pPVar2 = UnsafeVarTo<Js::PropertyString,Js::JavascriptString>(key),
     pPVar2 != (PropertyString *)0x0)) {
    (*(pPVar2->super_JavascriptString).super_RecyclableObject.super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x61])(pPVar2,&local_28,0);
    return local_28;
  }
  propertyName = JavascriptString::GetString(key);
  propertyNameLength = JavascriptString::GetLength(key);
  ThreadContext::GetOrAddPropertyId(threadContext,propertyName,propertyNameLength,&local_28);
  return local_28;
}

Assistant:

const PropertyRecord* TMapKey_ConvertKey_TTD(ThreadContext* threadContext, JavascriptString* key)
    {
        PropertyRecord const * propertyRecord;
        PropertyString * propertyString = JavascriptOperators::TryFromVar<PropertyString>(key);
        if (propertyString != nullptr)
        {
            propertyString->GetPropertyRecord(&propertyRecord);
        }
        else
        {
            threadContext->GetOrAddPropertyId(key->GetString(), key->GetLength(), &propertyRecord);
        }
        return propertyRecord;
    }